

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

void __thiscall
Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::AuxPtrs
          (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this,uint8 capacity,
          AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *ptr)

{
  this->ptrs[0].ptr = (void *)0x0;
  Memory::Recycler::WBSetBitRange((char *)this->ptrs,(uint)ptr->count);
  memcpy(this,ptr,(ulong)ptr->count * 8 + 0x20);
  Memory::_ArrayWriteBarrier<Memory::_write_barrier_policy>::
  WriteBarrier<Memory::WriteBarrierPtr<void>[1]>(&this->ptrs,(ulong)ptr->count);
  this->capacity = capacity;
  return;
}

Assistant:

AuxPtrs<T, FieldsEnum>::AuxPtrs(uint8 capacity, AuxPtrs* ptr)
    {
        ArrayWriteBarrierVerifyBits(&this->ptrs, ptr->count);
        memcpy(this, ptr, offsetof(AuxPtrs, ptrs) + ptr->count * sizeof(void*));
        ArrayWriteBarrier(&this->ptrs, ptr->count);
        this->capacity = capacity;
    }